

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cli.c
# Opt level: O0

void ssl_write_alpn_ext(mbedtls_ssl_context *ssl,uchar *buf,size_t *olen)

{
  uchar *puVar1;
  size_t sVar2;
  char **local_40;
  char **cur;
  size_t alpnlen;
  uchar *end;
  uchar *p;
  size_t *olen_local;
  uchar *buf_local;
  mbedtls_ssl_context *ssl_local;
  
  puVar1 = ssl->out_msg;
  cur = (char **)0x0;
  *olen = 0;
  if (ssl->conf->alpn_list != (char **)0x0) {
    mbedtls_debug_print_msg
              (ssl,3,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
               ,0x217,"client hello, adding alpn extension");
    for (local_40 = ssl->conf->alpn_list; *local_40 != (char *)0x0; local_40 = local_40 + 1) {
      sVar2 = strlen(*local_40);
      cur = (char **)((long)(int)((byte)sVar2 + 1) + (long)cur);
    }
    if ((puVar1 + 0x4000 < buf) || ((ulong)((long)(puVar1 + 0x4000) - (long)buf) < (long)cur + 6U))
    {
      mbedtls_debug_print_msg
                (ssl,1,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/aliyun-beta[P]aliyun-openapi-cpp-sdk/aliyun_api_core/third_party/mbedtls-2.1.2/library/ssl_cli.c"
                 ,0x21e,"buffer too small");
    }
    else {
      *buf = '\0';
      buf[1] = '\x10';
      end = buf + 6;
      for (local_40 = ssl->conf->alpn_list; *local_40 != (char *)0x0; local_40 = local_40 + 1) {
        sVar2 = strlen(*local_40);
        *end = (uchar)sVar2;
        memcpy(end + 1,*local_40,(ulong)*end);
        end = end + (int)(*end + 1);
      }
      *olen = (long)end - (long)buf;
      buf[4] = (uchar)(*olen - 6 >> 8);
      buf[5] = (char)*olen + 0xfa;
      buf[2] = (uchar)(*olen - 4 >> 8);
      buf[3] = (char)*olen + 0xfc;
    }
  }
  return;
}

Assistant:

static void ssl_write_alpn_ext( mbedtls_ssl_context *ssl,
                                unsigned char *buf, size_t *olen )
{
    unsigned char *p = buf;
    const unsigned char *end = ssl->out_msg + MBEDTLS_SSL_MAX_CONTENT_LEN;
    size_t alpnlen = 0;
    const char **cur;

    *olen = 0;

    if( ssl->conf->alpn_list == NULL )
    {
        return;
    }

    MBEDTLS_SSL_DEBUG_MSG( 3, ( "client hello, adding alpn extension" ) );

    for( cur = ssl->conf->alpn_list; *cur != NULL; cur++ )
        alpnlen += (unsigned char)( strlen( *cur ) & 0xFF ) + 1;

    if( end < p || (size_t)( end - p ) < 6 + alpnlen )
    {
        MBEDTLS_SSL_DEBUG_MSG( 1, ( "buffer too small" ) );
        return;
    }

    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_ALPN >> 8 ) & 0xFF );
    *p++ = (unsigned char)( ( MBEDTLS_TLS_EXT_ALPN      ) & 0xFF );

    /*
     * opaque ProtocolName<1..2^8-1>;
     *
     * struct {
     *     ProtocolName protocol_name_list<2..2^16-1>
     * } ProtocolNameList;
     */

    /* Skip writing extension and list length for now */
    p += 4;

    for( cur = ssl->conf->alpn_list; *cur != NULL; cur++ )
    {
        *p = (unsigned char)( strlen( *cur ) & 0xFF );
        memcpy( p + 1, *cur, *p );
        p += 1 + *p;
    }

    *olen = p - buf;

    /* List length = olen - 2 (ext_type) - 2 (ext_len) - 2 (list_len) */
    buf[4] = (unsigned char)( ( ( *olen - 6 ) >> 8 ) & 0xFF );
    buf[5] = (unsigned char)( ( ( *olen - 6 )      ) & 0xFF );

    /* Extension length = olen - 2 (ext_type) - 2 (ext_len) */
    buf[2] = (unsigned char)( ( ( *olen - 4 ) >> 8 ) & 0xFF );
    buf[3] = (unsigned char)( ( ( *olen - 4 )      ) & 0xFF );
}